

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathLangFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte *pbVar1;
  xmlChar *pxVar2;
  uint uVar3;
  xmlXPathObjectPtr pxVar4;
  xmlChar *pxVar5;
  __int32_t **pp_Var6;
  uint val;
  ulong uVar7;
  long lVar8;
  int iStack_40;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iStack_40 = 0xc;
    goto LAB_001d2f86;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iStack_40 = 0x17;
    goto LAB_001d2f86;
  }
  if (ctxt->value == (xmlXPathObjectPtr)0x0) {
LAB_001d2f84:
    iStack_40 = 0xb;
LAB_001d2f86:
    xmlXPathErr(ctxt,iStack_40);
    return;
  }
  if (ctxt->value->type != XPATH_STRING) {
    xmlXPathStringFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
    goto LAB_001d2f84;
  }
  pxVar4 = valuePop(ctxt);
  pxVar2 = pxVar4->stringval;
  pxVar5 = xmlNodeGetLang(ctxt->context->node);
  if (pxVar2 == (xmlChar *)0x0 || pxVar5 == (xmlChar *)0x0) {
    val = 0;
    uVar3 = 0;
    if (pxVar5 == (xmlChar *)0x0) goto LAB_001d2fc5;
  }
  else {
    lVar8 = 0;
    do {
      uVar7 = (ulong)pxVar2[lVar8];
      if (uVar7 == 0) {
        uVar3 = (uint)(pxVar5[lVar8] == '-' || pxVar5[lVar8] == '\0');
        goto LAB_001d2fb9;
      }
      pp_Var6 = __ctype_toupper_loc();
      pbVar1 = pxVar5 + lVar8;
      lVar8 = lVar8 + 1;
    } while ((*pp_Var6)[uVar7] == (*pp_Var6)[*pbVar1]);
    uVar3 = 0;
  }
LAB_001d2fb9:
  val = uVar3;
  (*xmlFree)(pxVar5);
LAB_001d2fc5:
  xmlXPathReleaseObject(ctxt->context,pxVar4);
  pxVar4 = xmlXPathCacheNewBoolean(ctxt->context,val);
  valuePush(ctxt,pxVar4);
  return;
}

Assistant:

void
xmlXPathLangFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr val = NULL;
    const xmlChar *theLang = NULL;
    const xmlChar *lang;
    int ret = 0;
    int i;

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    val = valuePop(ctxt);
    lang = val->stringval;
    theLang = xmlNodeGetLang(ctxt->context->node);
    if ((theLang != NULL) && (lang != NULL)) {
        for (i = 0;lang[i] != 0;i++)
	    if (toupper(lang[i]) != toupper(theLang[i]))
	        goto not_equal;
	if ((theLang[i] == 0) || (theLang[i] == '-'))
	    ret = 1;
    }
not_equal:
    if (theLang != NULL)
	xmlFree((void *)theLang);

    xmlXPathReleaseObject(ctxt->context, val);
    valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt->context, ret));
}